

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::onTimerError(Connection *this,error_code *error)

{
  int iVar1;
  string *desc;
  _func_int **pp_Var2;
  error_code *in_RSI;
  long in_RDI;
  Connection *in_stack_000000b8;
  Result *in_stack_ffffffffffffff50;
  ErrorType type;
  error_code *this_00;
  Connection *this_01;
  Result *in_stack_ffffffffffffff88;
  string local_70 [4];
  uint in_stack_ffffffffffffff94;
  RefCounter *in_stack_ffffffffffffff98;
  undefined1 local_50 [40];
  long local_28;
  undefined4 local_1c;
  undefined1 local_18 [24];
  
  desc = (string *)(in_RDI + 8);
  this_00 = (error_code *)local_70;
  local_50._8_8_ = in_RSI;
  std::error_code::message_abi_cxx11_(this_00);
  type = (ErrorType)((ulong)in_RDI >> 0x20);
  iVar1 = std::error_code::value((error_code *)local_50._8_8_);
  local_28 = (long)iVar1;
  this_01 = (Connection *)local_50;
  local_18._8_8_ = "Connection::onTimerError";
  local_1c._0_1_ = (__atomic_base<bool>)0x2;
  local_1c._1_1_ = (__atomic_base<bool>)0x0;
  local_1c._2_2_ = 0;
  local_18._0_8_ = this_00;
  local_18._16_8_ = this_01;
  pp_Var2 = (_func_int **)operator_new(0x38);
  ErrorResult::ErrorResult
            ((ErrorResult *)this_01,(char *)this_00,desc,type,(ErrorCodeT)in_stack_ffffffffffffff50)
  ;
  (this_01->super_IConnection)._vptr_IConnection = pp_Var2;
  RefCounter::StartShutdown
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  Result::~Result(in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_70);
  reportClose(this_01);
  removeFromMaps(in_stack_000000b8);
  return;
}

Assistant:

void Connection::onTimerError(const asio::error_code& error)
{
    /*
        Our Timer failed for some reason unexpectedly.  Maybe this happens during shutdown.
        This error is not recoverable so we should begin the disconnect process.
    */
    SelfRefCount.StartShutdown(Tonk_NetworkFailed,
        Result("Connection::onTimerError",
            error.message(),
            ErrorType::Asio,
            error.value()));

    // Report close to application since timer will no longer fire
    reportClose();

    removeFromMaps();
}